

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O3

void __thiscall ArgParser::ArgIterator::setcurrent(ArgIterator *this)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  this->longmatch = false;
  this->isoption = false;
  if (this->i != this->argc) {
    pcVar1 = this->argv[this->i];
    this->p = pcVar1;
    if (*pcVar1 == '\0') {
      lVar3 = 0;
    }
    else {
      lVar4 = 0;
      do {
        lVar3 = lVar4 + 1;
        lVar2 = lVar4 + 1;
        lVar4 = lVar3;
      } while (pcVar1[lVar2] != '\0');
    }
    this->pend = pcVar1 + lVar3;
    return;
  }
  this->p = (char *)0x0;
  this->pend = (char *)0x0;
  return;
}

Assistant:

void setcurrent()
        {
            longmatch = false;
            isoption = false;
            if (i==argc) {
                p = pend = nullptr;
                return;
            }
            p = argv[i];
            pend = p + stringlength(p);
        }